

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_flattener.h
# Opt level: O0

EExpr * __thiscall
mp::
ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::VisitSum(ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
           *this,SumExpr expr)

{
  bool bVar1;
  int iVar2;
  FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *this_00;
  iterator other;
  undefined8 in_RDX;
  ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_RSI;
  EExpr *in_RDI;
  iterator end;
  iterator i;
  BucketAccumulator<mp::EExpr> bucketaccum;
  QP2Passes qp2p;
  EExpr *ee1;
  QP2Passes *in_stack_ffffffffffff8d88;
  ExprBase in_stack_ffffffffffff8d90;
  QP2Passes *in_stack_ffffffffffff8d98;
  ExprBase e;
  ExprBase in_stack_ffffffffffff8da0;
  ExprBase other_00;
  size_t in_stack_ffffffffffff8da8;
  BucketAccumulator<mp::EExpr> *in_stack_ffffffffffff8db0;
  BucketAccumulator<mp::EExpr> *in_stack_ffffffffffff8f68;
  EExpr *in_stack_ffffffffffff8f78;
  BucketAccumulator<mp::EExpr> *in_stack_ffffffffffff8f80;
  ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> local_7050 [3522];
  undefined1 local_23d;
  undefined8 local_230;
  undefined8 local_10 [2];
  
  local_10[0] = in_RDX;
  this_00 = &GetFlatCvt(in_RSI)->
             super_FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ;
  iVar2 = FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
          ::IfParseQPIn2Passes(this_00);
  if (iVar2 == 0) {
    other_00.impl_ = (Impl *)local_10;
    BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
    ::num_args((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                *)0x61bd5e);
    BucketAccumulator<mp::EExpr>::BucketAccumulator
              (in_stack_ffffffffffff8db0,in_stack_ffffffffffff8da8);
    local_7050[0].ptr_ =
         (Impl **)BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                  ::begin((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                           *)in_stack_ffffffffffff8d88);
    other = BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
            ::end((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                   *)in_stack_ffffffffffff8d98);
    e.impl_ = (Impl *)other;
    while (bVar1 = internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                   operator!=(local_7050,
                              (ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>)
                              other.ptr_), bVar1) {
      in_stack_ffffffffffff8d90.impl_ =
           (Impl *)internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::
                   operator*((ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_> *)
                             in_stack_ffffffffffff8d88);
      BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
      BasicExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
                ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)e.impl_,
                 (BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>)other_00.impl_,
                 SUB84(in_stack_ffffffffffff8d90.impl_,4));
      Convert2EExpr((ProblemFlattener<mp::ProblemFltImpl<mp::ProblemFlattener,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>,_mp::BasicProblem<mp::BasicProblemParams<int>_>,_mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                     *)in_stack_ffffffffffff8d90.impl_,(Expr)e.impl_);
      BucketAccumulator<mp::EExpr>::Add(in_stack_ffffffffffff8f80,in_stack_ffffffffffff8f78);
      EExpr::~EExpr((EExpr *)0x61be40);
      internal::ExprIterator<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>_>::operator++
                (local_7050);
    }
    BucketAccumulator<mp::EExpr>::ExtractSum(in_stack_ffffffffffff8f68);
    BucketAccumulator<mp::EExpr>::~BucketAccumulator
              ((BucketAccumulator<mp::EExpr> *)in_stack_ffffffffffff8d90.impl_);
  }
  else {
    GetQP2PVisitor(in_RSI);
    QP2Passes::QP2Passes
              ((QP2Passes *)in_stack_ffffffffffff8da0.impl_,
               (BasicProblemFlattener *)in_stack_ffffffffffff8d98,
               (QP2PassVisitor *)in_stack_ffffffffffff8d90.impl_);
    local_230 = local_10[0];
    BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>::
    BasicExpr<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
              ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71> *)in_stack_ffffffffffff8d98,
               (BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
                )in_stack_ffffffffffff8da0.impl_,
               (type_conflict)((ulong)in_stack_ffffffffffff8d90.impl_ >> 0x20));
    QP2Passes::Process(in_stack_ffffffffffff8d98,(Expr)in_stack_ffffffffffff8da0.impl_);
    local_23d = 0;
    QP2Passes::GetResult(in_stack_ffffffffffff8d88);
    local_23d = 1;
    QP2Passes::~QP2Passes((QP2Passes *)in_stack_ffffffffffff8d90.impl_);
  }
  return in_RDI;
}

Assistant:

EExpr VisitSum(typename BaseExprVisitor::SumExpr expr) {
    if (GetFlatCvt().IfParseQPIn2Passes()) {
#ifdef DEBUG_QP2PASSES
      static int depth=0;
      ++depth;
      {
        fmt::MemoryWriter wrt;
        wrt << "FLATTEN: ";
        WriteExpr<typename ProblemType::ExprTypes>(
            wrt, LinearExpr{}, Cast<NumericExpr>(expr),
            GetModel().GetVarNamer());
        fmt::print("{:{}}{}\n", "", depth*2, wrt.str());
      }
#endif
      QP2Passes qp2p {*this, GetQP2PVisitor()};
      qp2p.Process(expr);
      // return qp2p.GetResult();
      auto ee1 = qp2p.GetResult();
#ifdef DEBUG_QP2PASSES
      {
        fmt::MemoryWriter wrt;
        BucketAccumulator<EExpr> bucketaccum(expr.num_args());
        for (auto i =
             expr.begin(), end = expr.end(); i != end; ++i)
          bucketaccum.Add( MP_DISPATCH( Convert2EExpr(*i) ) );
        auto ee2 = bucketaccum.ExtractSum();
        wrt << "FLAT DONE: ";
        WriteExpr<typename ProblemType::ExprTypes>(
            wrt, LinearExpr{}, Cast<NumericExpr>(expr),
            GetModel().GetVarNamer());
        fmt::print("{:{}}{}\n{:{}}RESULT: ",
                   "", depth*2,  wrt.str(), "", depth*2);
        wrt.clear();
        wrt << ee1.constant_term() << " + ";
        WriteModelItem(wrt, ee1.GetBody(), GetFlatCvt().GetVarNamer());
        fmt::print("{}\n", wrt.str());
        wrt.clear();
        wrt << ee2.constant_term() << " + ";
        WriteModelItem(wrt, ee2.GetBody(), GetFlatCvt().GetVarNamer());
        fmt::print("{:{}}RESULT_BUCKETS: {}\n",
                   "", depth*2,  wrt.str());
        MP_ASSERT_ALWAYS(ee1 == ee2, "AAAKKKAAAAK ... ");
      }
      --depth;
#endif
      return ee1;
    }  // else
    BucketAccumulator<EExpr> bucketaccum(expr.num_args());
    for (auto i =
         expr.begin(), end = expr.end(); i != end; ++i)
      bucketaccum.Add( MP_DISPATCH( Convert2EExpr(*i) ) );
    return bucketaccum.ExtractSum();
  }